

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache-aliasing.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer *pppiVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  pointer ppiVar7;
  undefined8 uVar8;
  long lVar9;
  pointer ppiVar10;
  vector<int_*,_std::allocator<int_*>_> data;
  allocator local_59;
  vector<int_*,_std::allocator<int_*>_> local_58;
  pointer local_38;
  
  if (argc < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Usage: cache-aliasing <count> <increment>",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    return 1;
  }
  std::__cxx11::string::string((string *)&local_58,argv[1],&local_59);
  ppiVar7 = local_58.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar3 = __errno_location();
  iVar2 = *piVar3;
  *piVar3 = 0;
  uVar4 = strtol((char *)ppiVar7,(char **)&local_38,10);
  if (local_38 == ppiVar7) {
    std::__throw_invalid_argument("stoi");
LAB_0010261e:
    std::__throw_out_of_range("stoi");
  }
  else {
    if (((long)(int)uVar4 != uVar4) || (*piVar3 == 0x22)) goto LAB_0010261e;
    if (*piVar3 == 0) {
      *piVar3 = iVar2;
    }
    pppiVar1 = &local_58.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    if ((pointer *)
        local_58.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
        _M_start != pppiVar1) {
      operator_delete(local_58.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::__cxx11::string::string((string *)&local_58,argv[2],&local_59);
    ppiVar7 = local_58.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar2 = *piVar3;
    *piVar3 = 0;
    lVar5 = strtol((char *)local_58.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                           super__Vector_impl_data._M_start,(char **)&local_38,10);
    if (local_38 != ppiVar7) {
      if ((0xfffffffeffffffff < lVar5 - 0x80000000U) && (*piVar3 != 0x22)) {
        if (*piVar3 == 0) {
          *piVar3 = iVar2;
        }
        lVar9 = (long)(int)uVar4;
        if ((pointer *)
            local_58.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_start != pppiVar1) {
          operator_delete(local_58.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar6 = (int)lVar5 * lVar9;
        uVar6 = -(ulong)(uVar6 >> 0x3e != 0) | uVar6 * 4;
        ppiVar7 = (pointer)operator_new__(uVar6);
        memset(ppiVar7,0,uVar6);
        local_58.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_58.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
        _M_finish = (int **)0x0;
        local_58.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (int **)0x0;
        if ((uVar4 & 0xffffffff) != 0) {
          lVar9 = lVar9 + (ulong)(lVar9 == 0);
          ppiVar10 = ppiVar7;
          do {
            local_38 = ppiVar10;
            if (local_58.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_58.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*>
                        ((vector<int*,std::allocator<int*>> *)&local_58,
                         (iterator)
                         local_58.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int **)&local_38);
            }
            else {
              *local_58.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
               super__Vector_impl_data._M_finish = (int *)ppiVar10;
              local_58.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_58.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            ppiVar10 = (pointer)((long)ppiVar10 + (long)(int)lVar5);
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        test_memory(&local_58);
        if (local_58.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        operator_delete__(ppiVar7);
        return 0;
      }
      goto LAB_00102636;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_00102636:
  uVar8 = std::__throw_out_of_range("stoi");
  if (local_58.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  operator_delete__(piVar3);
  _Unwind_Resume(uVar8);
}

Assistant:

int main(int argc, char** argv)
{
    if (argc < 3)
    {
        std::cout << "Usage: cache-aliasing <count> <increment>" << std::endl;
        return 1;
    }

    size_t count = static_cast<size_t>(std::stoi(argv[1]));
    size_t increment = static_cast<size_t>(std::stoi(argv[2]));

    auto memory = std::unique_ptr<int[]>(new int[count * increment]());
    auto startAddress = reinterpret_cast<size_t>(memory.get());

    std::vector<int*> data;

    for (size_t i = 0; i < count; i++)
    {
        data.push_back((int*)(startAddress + i * increment));
    }

    test_memory(data);

    return 0;
}